

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::testCaseEnded(JunitReporter *this,TestCaseStats *testCaseStats)

{
  TestCaseStats *testCaseStats_local;
  JunitReporter *this_local;
  
  std::operator<<((ostream *)&this->stdOutForSuite,(string *)&testCaseStats->stdOut);
  std::operator<<((ostream *)&this->stdErrForSuite,(string *)&testCaseStats->stdErr);
  CumulativeReporterBase::testCaseEnded(&this->super_CumulativeReporterBase,testCaseStats);
  return;
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) {
            stdOutForSuite << testCaseStats.stdOut;
            stdErrForSuite << testCaseStats.stdErr;
            CumulativeReporterBase::testCaseEnded( testCaseStats );
        }